

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

BBox * __thiscall CMU462::Face::bounds(BBox *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  
  (__return_storage_ptr__->max).x = -INFINITY;
  (__return_storage_ptr__->max).y = -INFINITY;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  (__return_storage_ptr__->extent).x = -INFINITY;
  (__return_storage_ptr__->extent).y = -INFINITY;
  (__return_storage_ptr__->extent).z = -INFINITY;
  p_Var1 = (this->_halfedge)._M_node;
  do {
    BBox::expand(__return_storage_ptr__,(Vector3D *)&p_Var1[2]._M_prev[1]._M_prev);
    p_Var1 = p_Var1[2]._M_next;
  } while (p_Var1 != (this->_halfedge)._M_node);
  return __return_storage_ptr__;
}

Assistant:

BBox Face::bounds() const {
  BBox box;

  // grow the bounding box to contain
  // all vertices contained in this face
  HalfedgeCIter h = halfedge();
  do {
    box.expand(h->vertex()->position);
    h = h->next();
  } while (h != halfedge());

  return box;
}